

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationY.hpp
# Opt level: O0

SquareMatrix<std::complex<float>_> __thiscall
qclab::qgates::RotationY<std::complex<float>_>::matrix(RotationY<std::complex<float>_> *this)

{
  complex<float> in_RCX;
  complex<float> m01;
  data_type extraout_RDX;
  QRotationGate1<std::complex<float>_> *in_RSI;
  complex<float> m00;
  complex<float> in_R8;
  double in_XMM0_Qa;
  double dVar1;
  double __x;
  double __x_00;
  double __x_01;
  SquareMatrix<std::complex<float>_> SVar2;
  complex<float> local_38;
  complex<float> local_30;
  complex<float> local_28;
  complex<float> local_20 [2];
  RotationY<std::complex<float>_> *this_local;
  
  m00._M_value = (_ComplexT)in_RSI;
  this_local = this;
  dVar1 = QRotationGate1<std::complex<float>_>::cos(in_RSI,in_XMM0_Qa);
  std::complex<float>::complex(local_20,SUB84(dVar1,0),0.0);
  dVar1 = QRotationGate1<std::complex<float>_>::sin(in_RSI,__x);
  std::complex<float>::complex(&local_28,-SUB84(dVar1,0),0.0);
  dVar1 = QRotationGate1<std::complex<float>_>::sin(in_RSI,__x_00);
  std::complex<float>::complex(&local_30,SUB84(dVar1,0),0.0);
  dVar1 = QRotationGate1<std::complex<float>_>::cos(in_RSI,__x_01);
  std::complex<float>::complex(&local_38,SUB84(dVar1,0),0.0);
  dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)this,m00,m01,in_RCX,in_R8);
  SVar2.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
       super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  SVar2.size_ = (size_type_conflict)this;
  return SVar2;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          return qclab::dense::SquareMatrix< T >( this->cos() , -this->sin() ,
                                                  this->sin() ,  this->cos() ) ;
        }